

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::CatalogSet::GetEntryInternal(CatalogSet *this,CatalogTransaction transaction,string *name)

{
  CatalogTransaction transaction_00;
  bool bVar1;
  CatalogEntry *ptr_p;
  undefined8 uVar2;
  CatalogEntry *catalog_entry;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  optional_ptr<duckdb::CatalogEntry,_true> *in_stack_ffffffffffffff10;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  CatalogEntryMap *in_stack_ffffffffffffff28;
  string local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  TransactionException *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [8];
  transaction_t in_stack_ffffffffffffff98;
  CatalogSet *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  transaction_t in_stack_ffffffffffffffd0;
  CatalogEntry *local_20 [3];
  optional_ptr<duckdb::CatalogEntry,_true> local_8;
  
  local_20[0] = (CatalogEntry *)
                CatalogEntryMap::GetEntry(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_20);
  if (bVar1) {
    ptr_p = optional_ptr<duckdb::CatalogEntry,_true>::operator*(in_stack_ffffffffffffff10);
    memcpy(&stack0xffffffffffffffb0,&stack0x00000008,0x28);
    ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff18);
    transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffffb8;
    transaction_00.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffffb0;
    transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffffc0;
    transaction_00.transaction_id = in_stack_ffffffffffffffc8;
    transaction_00.start_time = in_stack_ffffffffffffffd0;
    bVar1 = HasConflict(in_stack_ffffffffffffffa0,transaction_00,in_stack_ffffffffffffff98);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Catalog write-write conflict on alter with \"%s\"",&local_71);
      ::std::__cxx11::string::string(local_a8,(string *)&ptr_p->name);
      TransactionException::TransactionException<std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      __cxa_throw(uVar2,&TransactionException::typeinfo,TransactionException::~TransactionException)
      ;
    }
    if ((ptr_p->deleted & 1U) == 0) {
      optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&local_8,ptr_p);
    }
    else {
      optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&local_8,(CatalogEntry *)0x0);
    }
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&local_8,(CatalogEntry *)0x0);
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)local_8.ptr;
}

Assistant:

optional_ptr<CatalogEntry> CatalogSet::GetEntryInternal(CatalogTransaction transaction, const string &name) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		return nullptr;
	}
	auto &catalog_entry = *entry_value;

	// Check if this entry is visible to our snapshot
	if (HasConflict(transaction, catalog_entry.timestamp)) {
		// We intend to create a new version of the entry.
		// Another transaction has already made an edit to this catalog entry, because of limitations in the Catalog we
		// can't create an edit alongside this even if the other transaction might end up getting aborted. So we have to
		// abort the transaction.
		throw TransactionException("Catalog write-write conflict on alter with \"%s\"", catalog_entry.name);
	}
	// The entry is visible to our snapshot, check if it's deleted
	if (catalog_entry.deleted) {
		return nullptr;
	}
	return &catalog_entry;
}